

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ssl_cli.c
# Opt level: O0

int ssl_parse_truncated_hmac_ext(mbedtls_ssl_context *ssl,uchar *buf,size_t len)

{
  size_t len_local;
  uchar *buf_local;
  mbedtls_ssl_context *ssl_local;
  
  if (((*(uint *)&ssl->conf->field_0x174 >> 0xf & 1) == 0) || (len != 0)) {
    ssl_local._4_4_ = -0x7980;
  }
  else {
    ssl->session_negotiate->trunc_hmac = 1;
    ssl_local._4_4_ = 0;
  }
  return ssl_local._4_4_;
}

Assistant:

static int ssl_parse_truncated_hmac_ext( mbedtls_ssl_context *ssl,
                                         const unsigned char *buf,
                                         size_t len )
{
    if( ssl->conf->trunc_hmac == MBEDTLS_SSL_TRUNC_HMAC_DISABLED ||
        len != 0 )
    {
        return( MBEDTLS_ERR_SSL_BAD_HS_SERVER_HELLO );
    }

    ((void) buf);

    ssl->session_negotiate->trunc_hmac = MBEDTLS_SSL_TRUNC_HMAC_ENABLED;

    return( 0 );
}